

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

void __thiscall
JumpBasicOverride::buildLabels
          (JumpBasicOverride *this,Funcdata *fd,
          vector<Address,_std::allocator<Address>_> *addresstable,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *label,JumpModel *orig)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<Address,_std::allocator<Address>_> *pvVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  reference ad;
  value_type_conflict local_88;
  allocator local_79;
  string local_78 [40];
  EvaluationError *err;
  uint local_3c;
  uintb uStack_38;
  uint4 i;
  uintb addr;
  JumpModel *orig_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *label_local;
  vector<Address,_std::allocator<Address>_> *addresstable_local;
  Funcdata *fd_local;
  JumpBasicOverride *this_local;
  
  addr = (uintb)orig;
  orig_local = (JumpModel *)label;
  label_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)addresstable;
  addresstable_local = (vector<Address,_std::allocator<Address>_> *)fd;
  fd_local = (Funcdata *)this;
  for (local_3c = 0; uVar2 = (ulong)local_3c,
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->values),
      pvVar1 = addresstable_local, uVar2 < sVar3; local_3c = local_3c + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->values,(ulong)local_3c);
    uStack_38 = JumpBasic::backup2Switch
                          ((Funcdata *)pvVar1,*pvVar4,(this->super_JumpBasic).normalvn,
                           (this->super_JumpBasic).switchvn);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)orig_local,
               &stack0xffffffffffffffc8);
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)orig_local);
    sVar5 = std::vector<Address,_std::allocator<Address>_>::size
                      ((vector<Address,_std::allocator<Address>_> *)label_local);
    if (sVar5 <= sVar3) break;
  }
  while( true ) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)orig_local);
    sVar5 = std::vector<Address,_std::allocator<Address>_>::size
                      ((vector<Address,_std::allocator<Address>_> *)label_local);
    pvVar1 = addresstable_local;
    if (sVar5 <= sVar3) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Bad switch case",&local_79);
    this_00 = label_local;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)orig_local);
    ad = std::vector<Address,_std::allocator<Address>_>::operator[]
                   ((vector<Address,_std::allocator<Address>_> *)this_00,sVar3);
    Funcdata::warning((Funcdata *)pvVar1,(string *)local_78,ad);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_88 = 0xbad1abe1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)orig_local,&local_88);
  }
  return;
}

Assistant:

void JumpBasicOverride::buildLabels(Funcdata *fd,vector<Address> &addresstable,vector<uintb> &label,const JumpModel *orig) const

{
  uintb addr;

  for(uint4 i=0;i<values.size();++i) {
    try {
      addr = backup2Switch(fd,values[i],normalvn,switchvn);
    } catch(EvaluationError &err) {
      addr = 0xBAD1ABE1;
    }
    label.push_back(addr);
    if (label.size() >= addresstable.size()) break; // This should never happen
  }

  while(label.size() < addresstable.size()) {
    fd->warning("Bad switch case",addresstable[label.size()]); // This should never happen
    label.push_back(0xBAD1ABE1);
  }
}